

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superres_scale.c
# Opt level: O0

size_params_type calculate_next_size_params(AV1_COMP *cpi)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar4;
  AV1_COMP *in_RDI;
  size_params_type sVar5;
  AV1_COMP *in_stack_00000008;
  int resize_denom;
  FrameDimensionCfg *frm_dim_cfg;
  ResizePendingParams *resize_pending_params;
  AV1EncoderConfig *oxcf;
  size_params_type rsz;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar6;
  FrameDimensionCfg *pFVar7;
  ResizePendingParams *pRVar8;
  RESIZE_MODE resize_mode;
  AV1EncoderConfig *pAVar9;
  int local_c;
  int iStack_8;
  
  pAVar9 = &in_RDI->oxcf;
  pRVar8 = &in_RDI->resize_pending_params;
  pFVar7 = &(in_RDI->oxcf).frm_dim_cfg;
  local_c = pFVar7->width;
  iStack_8 = (in_RDI->oxcf).frm_dim_cfg.height;
  uVar2 = '\b';
  uVar6 = 8;
  iVar3 = has_no_stats_stage(in_RDI);
  if (((iVar3 == 0) || (in_RDI->ppi->use_svc == 0)) ||
     (((in_RDI->common).width == (in_RDI->oxcf).frm_dim_cfg.width &&
      ((in_RDI->common).height == (in_RDI->oxcf).frm_dim_cfg.height)))) {
    iVar3 = is_stat_generation_stage(in_RDI);
    uVar4 = extraout_RDX_00;
    if (iVar3 == 0) {
      if ((pRVar8->width == 0) || (pRVar8->height == 0)) {
        bVar1 = calculate_next_resize_scale((AV1_COMP *)CONCAT44(uVar6,in_stack_ffffffffffffffc8));
        uVar6 = (uint)bVar1;
        local_c = pFVar7->width;
        iStack_8 = pFVar7->height;
        av1_calculate_scaled_size
                  ((int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8,0);
      }
      else {
        local_c = pRVar8->width;
        iStack_8 = pRVar8->height;
        pRVar8->height = 0;
        pRVar8->width = 0;
        if ((pAVar9->superres_cfg).superres_mode == AOM_SUPERRES_NONE) goto LAB_00302f12;
      }
      resize_mode = (RESIZE_MODE)((ulong)pAVar9 >> 0x18);
      iVar3 = (int)((ulong)pFVar7 >> 0x20);
      uVar2 = calculate_next_superres_scale(in_stack_00000008);
      validate_size_scales
                (resize_mode,(aom_superres_mode)((ulong)pRVar8 >> 0x20),(int)pRVar8,iVar3,
                 (size_params_type *)CONCAT44(uVar6,in_stack_ffffffffffffffc8));
      uVar4 = extraout_RDX_01;
    }
  }
  else {
    local_c = (in_RDI->common).width;
    iStack_8 = (in_RDI->common).height;
    uVar4 = extraout_RDX;
  }
LAB_00302f12:
  sVar5.resize_height = iStack_8;
  sVar5.resize_width = local_c;
  sVar5._8_4_ = (undefined4)CONCAT71((int7)((ulong)uVar4 >> 8),uVar2);
  return sVar5;
}

Assistant:

static size_params_type calculate_next_size_params(AV1_COMP *cpi) {
  const AV1EncoderConfig *oxcf = &cpi->oxcf;
  ResizePendingParams *resize_pending_params = &cpi->resize_pending_params;
  const FrameDimensionCfg *const frm_dim_cfg = &oxcf->frm_dim_cfg;
  size_params_type rsz = { frm_dim_cfg->width, frm_dim_cfg->height,
                           SCALE_NUMERATOR };
  int resize_denom = SCALE_NUMERATOR;
  if (has_no_stats_stage(cpi) && cpi->ppi->use_svc &&
      (cpi->common.width != cpi->oxcf.frm_dim_cfg.width ||
       cpi->common.height != cpi->oxcf.frm_dim_cfg.height)) {
    rsz.resize_width = cpi->common.width;
    rsz.resize_height = cpi->common.height;
    return rsz;
  }
  if (is_stat_generation_stage(cpi)) return rsz;
  if (resize_pending_params->width && resize_pending_params->height) {
    rsz.resize_width = resize_pending_params->width;
    rsz.resize_height = resize_pending_params->height;
    resize_pending_params->width = resize_pending_params->height = 0;
    if (oxcf->superres_cfg.superres_mode == AOM_SUPERRES_NONE) return rsz;
  } else {
    resize_denom = calculate_next_resize_scale(cpi);
    rsz.resize_width = frm_dim_cfg->width;
    rsz.resize_height = frm_dim_cfg->height;
    av1_calculate_scaled_size(&rsz.resize_width, &rsz.resize_height,
                              resize_denom);
  }
  rsz.superres_denom = calculate_next_superres_scale(cpi);
  if (!validate_size_scales(oxcf->resize_cfg.resize_mode, cpi->superres_mode,
                            frm_dim_cfg->width, frm_dim_cfg->height, &rsz))
    assert(0 && "Invalid scale parameters");
  return rsz;
}